

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STParsedJSON.cpp
# Opt level: O0

void __thiscall
jbcoin::STParsedJSONArray::STParsedJSONArray(STParsedJSONArray *this,string *name,Value *json)

{
  bool bVar1;
  pointer_type this_00;
  STBase *pSVar2;
  STArray *local_f0;
  STArray *p;
  undefined1 local_a8 [8];
  optional<jbcoin::detail::STVar> arr;
  Value *json_local;
  string *name_local;
  STParsedJSONArray *this_local;
  
  boost::optional<jbcoin::STArray>::optional(&this->array);
  Json::Value::Value(&this->error,nullValue);
  STParsedJSONDetail::parseArray
            ((optional<jbcoin::detail::STVar> *)local_a8,name,json,(SField *)sfGeneric,0,
             &this->error);
  bVar1 = boost::optional<jbcoin::detail::STVar>::operator!
                    ((optional<jbcoin::detail::STVar> *)local_a8);
  if (bVar1) {
    boost::optional<jbcoin::STArray>::operator=(&this->array);
  }
  else {
    this_00 = boost::optional<jbcoin::detail::STVar>::operator->
                        ((optional<jbcoin::detail::STVar> *)local_a8);
    pSVar2 = jbcoin::detail::STVar::get(this_00);
    if (pSVar2 == (STBase *)0x0) {
      local_f0 = (STArray *)0x0;
    }
    else {
      local_f0 = (STArray *)__dynamic_cast(pSVar2,&STBase::typeinfo,&STArray::typeinfo,0);
    }
    if (local_f0 == (STArray *)0x0) {
      boost::optional<jbcoin::STArray>::operator=(&this->array);
    }
    else {
      boost::optional<jbcoin::STArray>::operator=(&this->array,local_f0);
    }
  }
  boost::optional<jbcoin::detail::STVar>::~optional((optional<jbcoin::detail::STVar> *)local_a8);
  return;
}

Assistant:

STParsedJSONArray::STParsedJSONArray (
    std::string const& name,
    Json::Value const& json)
{
    using namespace STParsedJSONDetail;
    auto arr = parseArray (name, json, sfGeneric, 0, error);
    if (!arr)
        array = boost::none;
    else
    {
        auto p = dynamic_cast <STArray*> (&arr->get());
        if (p == nullptr)
            array = boost::none;
        else
            array = std::move (*p);
    }
}